

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader-test.cc
# Opt level: O0

void TestReadString<mp::internal::IdentityConverter>
               (offset_in_BinaryReader<mp::internal::IdentityConverter>_to_subr read,
               bool change_endianness)

{
  NLStringRef data_00;
  NLStringRef data_01;
  NLStringRef data_02;
  bool bVar1;
  byte in_DL;
  long in_RSI;
  code *in_RDI;
  undefined1 auVar2 [16];
  BinaryReadError *e_1;
  bool gtest_caught_expected_1;
  string gtest_expected_message_1;
  AssertionResult gtest_ar_2;
  TestBinaryReader<mp::internal::IdentityConverter> reader_2;
  BinaryReadError *e;
  bool gtest_caught_expected;
  string gtest_expected_message;
  AssertionResult gtest_ar_1;
  string message;
  TestBinaryReader<mp::internal::IdentityConverter> reader_1;
  size_t size;
  AssertionResult gtest_ar;
  StringRef name;
  TestBinaryReader<mp::internal::IdentityConverter> reader;
  char *str;
  int data [3];
  TestBinaryReader<mp::internal::IdentityConverter> *in_stack_fffffffffffffb90;
  char (*in_stack_fffffffffffffb98) [4];
  char *in_stack_fffffffffffffba0;
  undefined4 in_stack_fffffffffffffba8;
  int in_stack_fffffffffffffbac;
  NLStringRef *in_stack_fffffffffffffbb0;
  undefined4 in_stack_fffffffffffffbb8;
  Type in_stack_fffffffffffffbbc;
  AssertionResult *in_stack_fffffffffffffbc0;
  CStringRef in_stack_fffffffffffffbc8;
  CStringRef in_stack_fffffffffffffbd0;
  char *in_stack_fffffffffffffbd8;
  size_t in_stack_fffffffffffffbe0;
  Message *in_stack_fffffffffffffc08;
  AssertHelper *in_stack_fffffffffffffc10;
  code *local_3b8;
  code *local_380;
  allocator<char> local_331;
  string local_330 [32];
  AssertionResult local_310;
  BasicCStringRef<char> local_300 [11];
  long local_2a8 [12];
  int local_244;
  undefined1 local_240 [16];
  byte local_229;
  string local_228 [32];
  AssertionResult local_208;
  BasicCStringRef<char> local_1f8;
  string local_1f0 [32];
  BasicCStringRef<char> local_1d0 [11];
  long local_178 [8];
  undefined8 local_138;
  string local_120 [32];
  AssertionResult local_100 [2];
  undefined1 local_e0 [16];
  BasicCStringRef<char> local_d0 [11];
  long local_78 [8];
  char *local_38;
  undefined8 local_30;
  undefined4 local_28;
  byte local_21;
  code *local_20;
  long local_18;
  
  local_21 = in_DL & 1;
  local_30 = 3;
  local_28 = 0;
  local_20 = in_RDI;
  local_18 = in_RSI;
  if (local_21 != 0) {
    ChangeEndianness<int>((int *)in_stack_fffffffffffffb90);
  }
  local_38 = (char *)((long)&local_30 + 4);
  strcpy(local_38,"abc");
  mp::NLStringRef::NLStringRef
            (in_stack_fffffffffffffbb0,
             (char *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8),
             (size_t)in_stack_fffffffffffffba0);
  fmt::BasicCStringRef<char>::BasicCStringRef(local_d0,"test");
  data_00.size_ = in_stack_fffffffffffffbe0;
  data_00.data_ = in_stack_fffffffffffffbd8;
  TestBinaryReader<mp::internal::IdentityConverter>::TestBinaryReader
            ((TestBinaryReader<mp::internal::IdentityConverter> *)in_stack_fffffffffffffbc8.data_,
             data_00,in_stack_fffffffffffffbd0);
  if (((ulong)local_20 & 1) == 0) {
    local_380 = local_20;
  }
  else {
    local_380 = *(code **)(local_20 + *(long *)((long)local_78 + local_18) + -1);
  }
  local_e0 = (*local_380)((long *)((long)local_78 + local_18));
  fmt::BasicStringRef<char>::to_string_abi_cxx11_
            ((BasicStringRef<char> *)in_stack_fffffffffffffbc8.data_);
  testing::internal::EqHelper<false>::Compare<char[4],std::__cxx11::string>
            ((char *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8),
             in_stack_fffffffffffffba0,in_stack_fffffffffffffb98,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffb90);
  std::__cxx11::string::~string(local_120);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_100);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffbc0);
    testing::AssertionResult::failure_message((AssertionResult *)0x186f2d);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffbc0,in_stack_fffffffffffffbbc,
               (char *)in_stack_fffffffffffffbb0,in_stack_fffffffffffffbac,in_stack_fffffffffffffba0
              );
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb90);
    testing::Message::~Message((Message *)0x186f90);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x187001);
  TestBinaryReader<mp::internal::IdentityConverter>::~TestBinaryReader(in_stack_fffffffffffffb90);
  local_38[2] = '\0';
  local_138 = 6;
  mp::NLStringRef::NLStringRef
            (in_stack_fffffffffffffbb0,
             (char *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8),
             (size_t)in_stack_fffffffffffffba0);
  fmt::BasicCStringRef<char>::BasicCStringRef(local_1d0,"test");
  data_01.size_ = in_stack_fffffffffffffbe0;
  data_01.data_ = in_stack_fffffffffffffbd8;
  TestBinaryReader<mp::internal::IdentityConverter>::TestBinaryReader
            ((TestBinaryReader<mp::internal::IdentityConverter> *)in_stack_fffffffffffffbc8.data_,
             data_01,in_stack_fffffffffffffbd0);
  fmt::BasicCStringRef<char>::BasicCStringRef(&local_1f8,"test:offset {}: unexpected end of file");
  fmt::format<unsigned_long>(in_stack_fffffffffffffbc8,(unsigned_long *)in_stack_fffffffffffffbc0);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_208);
  auVar2._8_8_ = in_stack_fffffffffffffc08;
  auVar2._0_8_ = in_stack_fffffffffffffc10;
  if (bVar1) {
    std::__cxx11::string::string(local_228,local_1f0);
    local_229 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    auVar2._8_8_ = in_stack_fffffffffffffc08;
    auVar2._0_8_ = in_stack_fffffffffffffc10;
    if (bVar1) {
      if (((ulong)local_20 & 1) == 0) {
        local_3b8 = local_20;
      }
      else {
        local_3b8 = *(code **)(local_20 + *(long *)((long)local_178 + local_18) + -1);
      }
      auVar2 = (*local_3b8)((long *)((long)local_178 + local_18));
      local_240 = auVar2;
    }
    if ((local_229 & 1) == 0) {
      testing::AssertionResult::operator<<
                (in_stack_fffffffffffffbc0,
                 (char (*) [105])CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
      local_244 = 2;
    }
    else {
      local_244 = 0;
    }
    std::__cxx11::string::~string(local_228);
    if (local_244 != 0) goto LAB_001874ab;
  }
  else {
LAB_001874ab:
    testing::Message::Message((Message *)in_stack_fffffffffffffbc0);
    testing::AssertionResult::failure_message((AssertionResult *)0x1874c7);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffbc0,in_stack_fffffffffffffbbc,
               (char *)in_stack_fffffffffffffbb0,in_stack_fffffffffffffbac,in_stack_fffffffffffffba0
              );
    testing::internal::AssertHelper::operator=(auVar2._0_8_,auVar2._8_8_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb90);
    testing::Message::~Message((Message *)0x187524);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x187579);
  std::__cxx11::string::~string(local_1f0);
  TestBinaryReader<mp::internal::IdentityConverter>::~TestBinaryReader(in_stack_fffffffffffffb90);
  local_30 = CONCAT44(local_30._4_4_,0xffffffff);
  if ((local_21 & 1) != 0) {
    ChangeEndianness<int>((int *)in_stack_fffffffffffffb90);
  }
  mp::NLStringRef::NLStringRef
            (in_stack_fffffffffffffbb0,
             (char *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8),
             (size_t)in_stack_fffffffffffffba0);
  fmt::BasicCStringRef<char>::BasicCStringRef(local_300,"test");
  data_02.size_ = in_stack_fffffffffffffbe0;
  data_02.data_ = in_stack_fffffffffffffbd8;
  TestBinaryReader<mp::internal::IdentityConverter>::TestBinaryReader
            ((TestBinaryReader<mp::internal::IdentityConverter> *)in_stack_fffffffffffffbc8.data_,
             data_02,in_stack_fffffffffffffbd0);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_310);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffbd0.data_,in_stack_fffffffffffffbc8.data_,
               (allocator<char> *)in_stack_fffffffffffffbc0);
    std::allocator<char>::~allocator(&local_331);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      if (((ulong)local_20 & 1) != 0) {
        local_20 = *(code **)(local_20 + *(long *)((long)local_2a8 + local_18) + -1);
      }
      in_stack_fffffffffffffba0 = (char *)(*local_20)((long *)((long)local_2a8 + local_18));
    }
    testing::AssertionResult::operator<<
              (in_stack_fffffffffffffbc0,
               (char (*) [105])CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
    local_244 = 3;
    std::__cxx11::string::~string(local_330);
    if (local_244 == 0) goto LAB_00187aae;
  }
  testing::Message::Message((Message *)in_stack_fffffffffffffbc0);
  in_stack_fffffffffffffb90 =
       (TestBinaryReader<mp::internal::IdentityConverter> *)
       testing::AssertionResult::failure_message((AssertionResult *)0x1879f3);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)in_stack_fffffffffffffbc0,in_stack_fffffffffffffbbc,
             (char *)in_stack_fffffffffffffbb0,in_stack_fffffffffffffbac,in_stack_fffffffffffffba0);
  testing::internal::AssertHelper::operator=(auVar2._0_8_,auVar2._8_8_);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb90);
  testing::Message::~Message((Message *)0x187a50);
LAB_00187aae:
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x187abb);
  TestBinaryReader<mp::internal::IdentityConverter>::~TestBinaryReader(in_stack_fffffffffffffb90);
  return;
}

Assistant:

void TestReadString(fmt::StringRef (BinaryReader<Converter>::*read)(),
                    bool change_endianness = false) {
  int data[] = {3, 0, 0};
  if (change_endianness)
    ChangeEndianness(data[0]);
  char *str = reinterpret_cast<char*>(data + 1);
  std::strcpy(str, "abc");
  {
    TestBinaryReader<Converter> reader(
          mp::NLStringRef(reinterpret_cast<char*>(data), sizeof(int) + 3));
    fmt::StringRef name = (reader.*read)();
    EXPECT_EQ("abc", name.to_string());
  }
  {
    str[2] = 0;
    std::size_t size = sizeof(int) + 2;
    TestBinaryReader<Converter> reader(
          mp::NLStringRef(reinterpret_cast<char*>(data), size));
    std::string message =
        fmt::format("test:offset {}: unexpected end of file", size);
    EXPECT_THROW_MSG((reader.*read)(), mp::BinaryReadError, message);
  }
  data[0] = -1;
  if (change_endianness)
    ChangeEndianness(data[0]);
  {
    TestBinaryReader<Converter> reader(
          mp::NLStringRef(reinterpret_cast<char*>(data), sizeof(int) + 3));
    EXPECT_THROW_MSG((reader.*read)(), mp::BinaryReadError,
                     "test:offset 0: expected unsigned integer");
  }
}